

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

ssize_t getPassword(uint8_t *prompt,uint8_t *line_buff,size_t buff_size,FILE *stream)

{
  int iVar1;
  int __fd;
  __ssize_t _Var2;
  ssize_t sVar3;
  uint8_t *line_buff_local;
  size_t buff_size_local;
  termios old;
  termios new;
  
  line_buff_local = line_buff;
  buff_size_local = buff_size;
  if (prompt != (uint8_t *)0x0) {
    puts((char *)prompt);
  }
  iVar1 = fileno((FILE *)stream);
  iVar1 = tcgetattr(iVar1,(termios *)&old);
  sVar3 = -1;
  if (iVar1 == 0) {
    new.c_iflag = old.c_iflag;
    new.c_oflag = old.c_oflag;
    new.c_ispeed = old.c_ispeed;
    new.c_ospeed = old.c_ospeed;
    new.c_cc[0xf] = old.c_cc[0xf];
    new.c_cc[0x10] = old.c_cc[0x10];
    new.c_cc[0x11] = old.c_cc[0x11];
    new.c_cc[0x12] = old.c_cc[0x12];
    new.c_cc[0x13] = old.c_cc[0x13];
    new.c_cc[0x14] = old.c_cc[0x14];
    new.c_cc[0x15] = old.c_cc[0x15];
    new.c_cc[0x16] = old.c_cc[0x16];
    new.c_line = old.c_line;
    new.c_cc[0] = old.c_cc[0];
    new.c_cc[1] = old.c_cc[1];
    new.c_cc[2] = old.c_cc[2];
    new.c_cc[3] = old.c_cc[3];
    new.c_cc[4] = old.c_cc[4];
    new.c_cc[5] = old.c_cc[5];
    new.c_cc[6] = old.c_cc[6];
    new.c_cc[7] = old.c_cc[7];
    new.c_cc[8] = old.c_cc[8];
    new.c_cc[9] = old.c_cc[9];
    new.c_cc[10] = old.c_cc[10];
    new.c_cc[0xb] = old.c_cc[0xb];
    new.c_cc[0xc] = old.c_cc[0xc];
    new.c_cc[0xd] = old.c_cc[0xd];
    new.c_cc[0xe] = old.c_cc[0xe];
    new._8_8_ = old._8_8_ & 0xfffffff7ffffffff;
    iVar1 = fileno((FILE *)stream);
    iVar1 = tcsetattr(iVar1,2,(termios *)&new);
    if (iVar1 == 0) {
      _Var2 = getline((char **)&line_buff_local,&buff_size_local,(FILE *)stream);
      iVar1 = (int)_Var2;
      if (0 < iVar1) {
        if (line_buff_local[iVar1 - 1U] == '\n') {
          line_buff_local[iVar1 - 1U] = '\0';
          iVar1 = iVar1 + -1;
        }
      }
      __fd = fileno((FILE *)stream);
      tcsetattr(__fd,2,(termios *)&old);
      sVar3 = (ssize_t)iVar1;
    }
  }
  return sVar3;
}

Assistant:

ssize_t getPassword(uint8_t* prompt, uint8_t* line_buff, size_t buff_size, FILE* stream)
{
    struct termios old, new;
    int nread = -1;

    /* Display the prompt */
    if (prompt != NULL) { printf("%s\n", prompt); }

    /* Turn off echoing and fail if we can't */
    if (tcgetattr(fileno(stream), &old) != 0) { return nread; }

    new = old;
    new.c_lflag &= ~ECHO;

    if (tcsetattr(fileno(stream), TCSAFLUSH, &new) != 0) { return nread; }

    /* Read the password. */
    nread = getline((char**)&line_buff, &buff_size, stream);

    /* Strip out the carriage return */
    if(nread >= 1 && line_buff[nread -1] == '\n')
    {
        line_buff[nread-1] = 0;
        nread--;
    }

    /* turn echo back on */
    (void)tcsetattr(fileno(stream), TCSAFLUSH, &old);

    return nread;
}